

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrSubmitDebugUtilsMessageEXT
                   (XrInstance instance,XrDebugUtilsMessageSeverityFlagsEXT messageSeverity,
                   XrDebugUtilsMessageTypeFlagsEXT messageTypes,
                   XrDebugUtilsMessengerCallbackDataEXT *callbackData)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  GenValidUsageXrInstanceInfo *instance_info;
  char cVar3;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *p_Var4;
  undefined4 in_stack_fffffffffffffd28;
  uint32_t in_stack_fffffffffffffd2c;
  string local_2d0;
  string local_2b0;
  string local_290;
  XrInstance instance_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_248;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_230;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_218;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_200;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b8;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 1;
  instance_local = instance;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrInstance_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&instance_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrInstanceHandle(&instance_local);
  if (VVar1 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrInstance handle \"instance\" ");
    HandleToHexString<XrInstance_T*>
              ((XrInstance_T *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    std::operator<<((ostream *)&oss,(string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::string
              ((string *)&local_2d0,"VUID-xrSubmitDebugUtilsMessageEXT-instance-parameter",
               (allocator *)&stack0xfffffffffffffd2f);
    std::__cxx11::string::string
              ((string *)&local_2b0,"xrSubmitDebugUtilsMessageEXT",
               (allocator *)&stack0xfffffffffffffd2e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b8,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_2d0,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b8,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b8);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
    goto LAB_001d1e31;
  }
  instance_info =
       HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                 (&g_instance_info.super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>
                  ,instance_local);
  cVar3 = ((messageSeverity & 0xffffffffffffeeee) == 0) + '\x01';
  if (messageSeverity == 0) {
    cVar3 = '\0';
  }
  if (cVar3 == '\x02') {
    cVar3 = (messageTypes < 0x10) + '\x01';
    if (messageTypes == 0) {
      cVar3 = '\0';
    }
    if (cVar3 == '\x02') {
      if (callbackData == (XrDebugUtilsMessengerCallbackDataEXT *)0x0) {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrSubmitDebugUtilsMessageEXT-callbackData-parameter",
                   (allocator *)&local_290);
        std::__cxx11::string::string
                  ((string *)&local_2d0,"xrSubmitDebugUtilsMessageEXT",
                   (allocator *)&stack0xfffffffffffffd2f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_230,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_2b0,
                   "Invalid NULL for XrDebugUtilsMessengerCallbackDataEXT \"callbackData\" which is not optional and must be non-NULL"
                   ,(allocator *)&stack0xfffffffffffffd2e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2d0
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_230,&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        p_Var4 = &local_230;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&oss,"xrSubmitDebugUtilsMessageEXT",(allocator *)&local_2d0);
        XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,true,true,callbackData);
        std::__cxx11::string::~string((string *)&oss);
        if (XVar2 == XR_SUCCESS) {
          XVar2 = XR_SUCCESS;
          goto LAB_001d1e31;
        }
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrSubmitDebugUtilsMessageEXT-callbackData-parameter",
                   (allocator *)&local_290);
        std::__cxx11::string::string
                  ((string *)&local_2d0,"xrSubmitDebugUtilsMessageEXT",
                   (allocator *)&stack0xfffffffffffffd2f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_248,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_2b0,
                   "Command xrSubmitDebugUtilsMessageEXT param callbackData is invalid",
                   (allocator *)&stack0xfffffffffffffd2e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2d0
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_248,&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        p_Var4 = &local_248;
      }
    }
    else {
      if (cVar3 != '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        std::operator<<((ostream *)&oss,
                        "Invalid XrDebugUtilsMessageTypeFlagsEXT \"messageTypes\" flag value ");
        Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd2c);
        std::operator<<((ostream *)&oss,(string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::operator<<((ostream *)&oss," contains illegal bit");
        std::__cxx11::string::string
                  ((string *)&local_2d0,"VUID-xrSubmitDebugUtilsMessageEXT-messageTypes-parameter",
                   (allocator *)&stack0xfffffffffffffd2f);
        std::__cxx11::string::string
                  ((string *)&local_2b0,"xrSubmitDebugUtilsMessageEXT",
                   (allocator *)&stack0xfffffffffffffd2e);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_218,&objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&local_2d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_218,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        p_Var4 = &local_218;
        goto LAB_001d1d59;
      }
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrSubmitDebugUtilsMessageEXT-messageTypes-requiredbitmask",
                 (allocator *)&local_290);
      std::__cxx11::string::string
                ((string *)&local_2d0,"xrSubmitDebugUtilsMessageEXT",
                 (allocator *)&stack0xfffffffffffffd2f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_200,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_2b0,
                 "XrDebugUtilsMessageTypeFlagsEXT \"messageTypes\" flag must be non-zero",
                 (allocator *)&stack0xfffffffffffffd2e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2d0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_200,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      p_Var4 = &local_200;
    }
LAB_001d1e12:
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(p_Var4);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&oss);
  }
  else {
    if (cVar3 == '\0') {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrSubmitDebugUtilsMessageEXT-messageSeverity-requiredbitmask",
                 (allocator *)&local_290);
      std::__cxx11::string::string
                ((string *)&local_2d0,"xrSubmitDebugUtilsMessageEXT",
                 (allocator *)&stack0xfffffffffffffd2f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1d0,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_2b0,
                 "XrDebugUtilsMessageSeverityFlagsEXT \"messageSeverity\" flag must be non-zero",
                 (allocator *)&stack0xfffffffffffffd2e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2d0,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1d0,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      p_Var4 = &local_1d0;
      goto LAB_001d1e12;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,
                    "Invalid XrDebugUtilsMessageSeverityFlagsEXT \"messageSeverity\" flag value ");
    Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd2c);
    std::operator<<((ostream *)&oss,(string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::operator<<((ostream *)&oss," contains illegal bit");
    std::__cxx11::string::string
              ((string *)&local_2d0,"VUID-xrSubmitDebugUtilsMessageEXT-messageSeverity-parameter",
               (allocator *)&stack0xfffffffffffffd2f);
    std::__cxx11::string::string
              ((string *)&local_2b0,"xrSubmitDebugUtilsMessageEXT",
               (allocator *)&stack0xfffffffffffffd2e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e8,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&local_2d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e8,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    p_Var4 = &local_1e8;
LAB_001d1d59:
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(p_Var4);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  }
  XVar2 = XR_ERROR_VALIDATION_FAILURE;
LAB_001d1e31:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrSubmitDebugUtilsMessageEXT(
XrInstance instance,
XrDebugUtilsMessageSeverityFlagsEXT messageSeverity,
XrDebugUtilsMessageTypeFlagsEXT messageTypes,
const XrDebugUtilsMessengerCallbackDataEXT* callbackData) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(instance, XR_OBJECT_TYPE_INSTANCE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrInstanceHandle(&instance);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrInstance handle \"instance\" ";
                oss << HandleToHexString(instance);
                CoreValidLogMessage(nullptr, "VUID-xrSubmitDebugUtilsMessageEXT-instance-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        (void)gen_instance_info;  // quiet warnings
        ValidateXrFlagsResult debug_utils_message_severity_flags_ext_result = ValidateXrDebugUtilsMessageSeverityFlagsEXT(messageSeverity);
        // Flags must be non-zero in this case.
        if (VALIDATE_XR_FLAGS_ZERO == debug_utils_message_severity_flags_ext_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrSubmitDebugUtilsMessageEXT-messageSeverity-requiredbitmask",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT",
                                objects_info, "XrDebugUtilsMessageSeverityFlagsEXT \"messageSeverity\" flag must be non-zero");
            return XR_ERROR_VALIDATION_FAILURE;
        } else if (VALIDATE_XR_FLAGS_SUCCESS != debug_utils_message_severity_flags_ext_result) {
            // Otherwise, flags must be valid.
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrDebugUtilsMessageSeverityFlagsEXT \"messageSeverity\" flag value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(messageSeverity));
            oss_enum <<" contains illegal bit";
            CoreValidLogMessage(gen_instance_info, "VUID-xrSubmitDebugUtilsMessageEXT-messageSeverity-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        ValidateXrFlagsResult debug_utils_message_type_flags_ext_result = ValidateXrDebugUtilsMessageTypeFlagsEXT(messageTypes);
        // Flags must be non-zero in this case.
        if (VALIDATE_XR_FLAGS_ZERO == debug_utils_message_type_flags_ext_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrSubmitDebugUtilsMessageEXT-messageTypes-requiredbitmask",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT",
                                objects_info, "XrDebugUtilsMessageTypeFlagsEXT \"messageTypes\" flag must be non-zero");
            return XR_ERROR_VALIDATION_FAILURE;
        } else if (VALIDATE_XR_FLAGS_SUCCESS != debug_utils_message_type_flags_ext_result) {
            // Otherwise, flags must be valid.
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrDebugUtilsMessageTypeFlagsEXT \"messageTypes\" flag value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(messageTypes));
            oss_enum <<" contains illegal bit";
            CoreValidLogMessage(gen_instance_info, "VUID-xrSubmitDebugUtilsMessageEXT-messageTypes-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == callbackData) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrSubmitDebugUtilsMessageEXT-callbackData-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT", objects_info,
                                "Invalid NULL for XrDebugUtilsMessengerCallbackDataEXT \"callbackData\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrDebugUtilsMessengerCallbackDataEXT is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrSubmitDebugUtilsMessageEXT", objects_info,
                                                        true, true, callbackData);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrSubmitDebugUtilsMessageEXT-callbackData-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSubmitDebugUtilsMessageEXT",
                                objects_info,
                                "Command xrSubmitDebugUtilsMessageEXT param callbackData is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}